

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O3

ostream * __thiscall Al::internal::ProgressEngine::dump_state(ProgressEngine *this,ostream *ss)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  _Hash_node_base *p_Var9;
  long *local_78;
  long local_70;
  long local_68 [2];
  _Hash_node_base *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  p_Var9 = (this->run_queues)._M_h._M_before_begin._M_nxt;
  while (p_Var9 != (_Hash_node_base *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(ss,"Pipelined run queue for stream ",0x1f);
    poVar5 = std::ostream::_M_insert<void_const*>(ss);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
    lVar8 = 0;
    local_58 = p_Var9;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      p_Var1 = p_Var9[lVar8 * 3 + 3]._M_nxt;
      p_Var2 = p_Var9[lVar8 * 3 + 2]._M_nxt;
      lVar6 = (long)p_Var1 - (long)p_Var2 >> 3;
      std::__ostream_insert<char,std::char_traits<char>>(ss,"Stage ",6);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)ss);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," run queue (",0xc);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):\n",3);
      if (p_Var1 != p_Var2) {
        lVar7 = 0;
        do {
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)ss);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          p_Var1 = p_Var9[lVar8 * 3 + 2]._M_nxt[lVar7]._M_nxt;
          if (p_Var1 == (_Hash_node_base *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>(ss,"(unknown)\n",10);
          }
          else {
            (*(code *)p_Var1->_M_nxt[6]._M_nxt)(&local_50);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (ss,(char *)local_50,local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            (*(code *)(p_Var9[lVar8 * 3 + 2]._M_nxt[lVar7]._M_nxt)->_M_nxt[7]._M_nxt)(&local_78);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_78,local_70);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
      }
      lVar8 = 1;
      bVar3 = false;
    } while (bVar4);
    p_Var9 = local_58->_M_nxt;
  }
  return ss;
}

Assistant:

std::ostream& ProgressEngine::dump_state(std::ostream& ss) {
  // Note: This pulls *directly from internal state*.
  // This is *not* thread safe, and stuff might blow up.
  // You should only be dumping state where you don't care about that anyway.
  for (auto&& stream_pipeline_pair : run_queues) {
    ss << "Pipelined run queue for stream " << stream_pipeline_pair.first << ":\n";
    auto&& pipeline = stream_pipeline_pair.second;
    for (size_t stage = 0; stage < AL_PE_NUM_PIPELINE_STAGES; ++stage) {
      const size_t stage_queue_size = pipeline[stage].size();
      ss << "Stage " << stage << " run queue (" << stage_queue_size << "):\n";
      for (size_t i = 0; i < stage_queue_size; ++i) {
        ss << i << ": ";
        if (pipeline[stage][i]) {
          ss << pipeline[stage][i]->get_name() << " "
             << pipeline[stage][i]->get_desc() << "\n";
        } else {
          ss << "(unknown)\n";
        }
      }
    }
  }
  return ss;
}